

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void crnlib::vector<crnlib::dxt_hc::tile_details>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  
  if (num != 0) {
    puVar1 = (undefined8 *)((long)pSrc_void + (ulong)num * 0x48);
    do {
      ((elemental_vector *)pDst_void)->m_p = (void *)0x0;
      ((elemental_vector *)pDst_void)->m_size = 0;
      ((elemental_vector *)pDst_void)->m_capacity = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)pDst_void,*(uint *)((long)pSrc_void + 8),false,4,
                 (object_mover)0x0,false);
      uVar2 = *(uint *)((long)pSrc_void + 8);
      ((elemental_vector *)pDst_void)->m_size = uVar2;
      memcpy(((elemental_vector *)pDst_void)->m_p,*pSrc_void,(ulong)uVar2 << 2);
      *(undefined4 *)&((elemental_vector *)((long)pDst_void + 0x10))->m_p =
           *(undefined4 *)((long)pSrc_void + 0x10);
      lVar3 = 5;
      do {
        *(undefined4 *)((long)&((elemental_vector *)pDst_void)->m_p + lVar3 * 4) =
             *(undefined4 *)((long)pSrc_void + lVar3 * 4);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0xb);
      lVar3 = 6;
      do {
        *(undefined4 *)((long)pDst_void + lVar3 * 8 + -4) =
             *(undefined4 *)((long)pSrc_void + lVar3 * 8 + -4);
        *(undefined4 *)(&((elemental_vector *)pDst_void)->m_p + lVar3) =
             *(undefined4 *)((long)pSrc_void + lVar3 * 8);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
      *(undefined2 *)&((elemental_vector *)((long)pDst_void + 0x40))->m_p =
           *(undefined2 *)((long)pSrc_void + 0x40);
      ((elemental_vector *)((long)pDst_void + 0x30))->m_capacity = *(uint *)((long)pSrc_void + 0x3c)
      ;
      if (*pSrc_void != (void *)0x0) {
        crnlib_free(*pSrc_void);
      }
      pSrc_void = (void *)((long)pSrc_void + 0x48);
      pDst_void = &((elemental_vector *)((long)pDst_void + 0x40))->m_size;
    } while ((undefined8 *)pSrc_void != puVar1);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }